

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::RgbaInputFile::RgbaInputFile
          (RgbaInputFile *this,int partNumber,char *name,string *layerName,int numThreads)

{
  RgbaChannels RVar1;
  void *pvVar2;
  Header *header;
  FromYca *in_RCX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  RgbaChannels rgbaChannels;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  MultiPartInputFile *in_stack_ffffffffffffff48;
  InputPart *in_stack_ffffffffffffff50;
  string *layerName_00;
  string local_58 [27];
  undefined1 in_stack_ffffffffffffffc3;
  int in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  RgbaChannels in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  
  *in_RDI = &PTR__RgbaInputFile_004bab08;
  pvVar2 = operator_new(0x20);
  MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(bool)in_stack_ffffffffffffffc3);
  in_RDI[1] = pvVar2;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  layerName_00 = (string *)(in_RDI + 4);
  std::__cxx11::string::string((string *)layerName_00);
  pvVar2 = operator_new(8);
  InputPart::InputPart
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  in_RDI[2] = pvVar2;
  header = InputPart::header((InputPart *)0x137b73);
  anon_unknown_1::prefixFromLayerName(layerName_00,header);
  std::__cxx11::string::operator=((string *)(in_RDI + 4),local_58);
  std::__cxx11::string::~string(local_58);
  RVar1 = channels((RgbaInputFile *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if ((RVar1 & WRITE_C) != 0) {
    pvVar2 = operator_new(0x188);
    FromYca::FromYca(in_RCX,(InputPart *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                     in_stack_ffffffffffffffd4);
    in_RDI[3] = pvVar2;
  }
  return;
}

Assistant:

RgbaInputFile::RgbaInputFile (
    int partNumber, const char name[], const string& layerName, int numThreads)
    : _multiPartFile (new MultiPartInputFile (name, numThreads))
    , _inputPart (nullptr)
    , _fromYca (0)
{
    try
    {
        _inputPart = new InputPart (*_multiPartFile, partNumber);
        _channelNamePrefix =
            prefixFromLayerName (layerName, _inputPart->header ());
        RgbaChannels rgbaChannels = channels ();

        if (rgbaChannels & WRITE_C)
            _fromYca = new FromYca (*_inputPart, rgbaChannels);
    }
    catch (...)
    {
        if (_inputPart) { delete _inputPart; }
        delete _multiPartFile;
        throw;
    }
}